

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

int __thiscall
duckdb::QuantileSortTree::WindowScalar<int,int,true>
          (QuantileSortTree *this,QuantileCursor<int> *data,SubFrames *frames,idx_t n,Vector *result
          ,QuantileValue *q)

{
  int iVar1;
  WindowMergeSortTree *this_00;
  idx_t iVar2;
  pointer pWVar3;
  unsigned_long hidx;
  pair<unsigned_long,_unsigned_long> pVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  Interpolator<true> interp;
  ID indirect;
  Interpolator<true> local_60;
  QuantileIndirect<int> local_38;
  
  this_00 = &unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree)->super_WindowMergeSortTree;
  WindowMergeSortTree::Build(this_00);
  local_60.desc = false;
  iVar2 = Interpolator<true>::Index(q,n);
  local_60.begin = 0;
  local_60.FRN = iVar2;
  local_60.CRN = iVar2;
  local_60.end = n;
  pWVar3 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&this->index_tree);
  pVar4 = WindowIndexTree::SelectNth(pWVar3,frames,iVar2);
  iVar2 = local_60.CRN;
  hidx = pVar4.first;
  if (local_60.CRN != local_60.FRN) {
    pWVar3 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree);
    pVar5 = WindowIndexTree::SelectNth(pWVar3,frames,iVar2);
    hidx = pVar5.first;
  }
  local_38.data = data;
  iVar1 = Interpolator<true>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
                    (&local_60,pVar4.first,hidx,result,&local_38);
  return iVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}